

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O0

void __thiscall
anon_unknown.dwarf_76195f::TransformSelectorFor::~TransformSelectorFor(TransformSelectorFor *this)

{
  TransformSelectorFor *this_local;
  
  ~TransformSelectorFor(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

TransformSelectorFor(int start, int stop, int step)
    : TransformSelectorIndexes("FOR")
    , Start(start)
    , Stop(stop)
    , Step(step)
  {
  }